

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::commit_app_log
          (raft_server *this,ulong idx_to_commit,ptr<log_entry> *le,bool need_to_handle_commit_elem)

{
  return_method_type rVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong *puVar5;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  byte in_CL;
  ulong in_RSI;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_shared_ptr<commit_ret_elem>_>_>::value,_pair<iterator,_bool>_>
  _Var12;
  ptr<std::exception> err;
  ptr<commit_ret_elem> *elem_2;
  shared_ptr<nuraft::raft_server::commit_ret_elem> *entry_1;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  *__range1;
  ptr<commit_ret_elem> elem_1;
  ptr<commit_ret_elem> elem;
  iterator entry;
  bool need_to_check_commit_ret;
  unique_lock<std::mutex> cre_lock;
  list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  async_elems;
  ulong pc_idx;
  ulong sm_idx;
  ptr<buffer> buf;
  ptr<buffer> ret_value;
  memory_order __b;
  log_entry *in_stack_fffffffffffffd28;
  element_type *in_stack_fffffffffffffd30;
  iterator in_stack_fffffffffffffd38;
  cmd_result_code code;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffd44;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
  in_stack_fffffffffffffd48;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
  *in_stack_fffffffffffffd50;
  undefined1 local_208 [16];
  reference local_1f8;
  reference local_1f0;
  _Self local_1e8;
  _Self local_1e0;
  undefined1 *local_1d8;
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  string local_188 [32];
  __shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2> local_168;
  _Base_ptr local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  _Base_ptr local_140;
  string local_128 [48];
  _Self local_f8;
  _Self local_f0;
  byte local_e1;
  undefined1 local_d0 [24];
  ext_op_params local_b8;
  undefined1 local_a8 [16];
  string local_98 [32];
  ulong local_78;
  ulong local_70;
  ptr<buffer> local_58;
  __shared_ptr local_48 [23];
  byte local_31;
  ulong local_28;
  ulong local_18;
  memory_order local_10;
  int local_c;
  ulong *local_8;
  
  local_31 = in_CL & 1;
  local_28 = in_RSI;
  std::shared_ptr<nuraft::buffer>::shared_ptr
            (&in_stack_fffffffffffffd30->empty_result_,in_stack_fffffffffffffd28);
  std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2e4978);
  log_entry::get_buf_ptr(in_stack_fffffffffffffd28);
  std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2e4997);
  nuraft::buffer::pos((buffer *)in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48._M_node)
  ;
  local_70 = local_28;
  puVar5 = (ulong *)(in_RDI + 0x90);
  local_c = 5;
  local_8 = puVar5;
  local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_c - 1U < 2) {
    local_18 = *puVar5;
  }
  else if (local_c == 5) {
    local_18 = *puVar5;
  }
  else {
    local_18 = *puVar5;
  }
  local_78 = local_18;
  if (local_70 <= local_18) {
    peVar8 = std::
             __shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e4c08);
    state_machine::ext_op_params::ext_op_params(&local_b8,local_70,&local_58);
    (*peVar8->_vptr_state_machine[3])(local_a8,peVar8,&local_b8);
    std::shared_ptr<nuraft::buffer>::operator=
              (&in_stack_fffffffffffffd30->empty_result_,
               (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd28);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x2e4c74);
    bVar3 = std::__shared_ptr::operator_cast_to_bool(local_48);
    if (bVar3) {
      std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2e4c94);
      nuraft::buffer::pos((buffer *)in_stack_fffffffffffffd50,
                          (size_t)in_stack_fffffffffffffd48._M_node);
    }
    std::__cxx11::
    list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ::list((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
            *)0x2e4cb1);
    if ((local_31 & 1) != 0) {
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffd30,
                 (mutex_type *)in_stack_fffffffffffffd28);
      local_e1 = local_70 == local_78;
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
           ::find((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                   *)in_stack_fffffffffffffd28,(key_type *)0x2e4d14);
      local_f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
           ::end((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                  *)in_stack_fffffffffffffd28);
      bVar3 = std::operator!=(&local_f0,&local_f8);
      if (bVar3) {
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                      *)in_stack_fffffffffffffd30);
        std::shared_ptr<nuraft::raft_server::commit_ret_elem>::shared_ptr
                  ((shared_ptr<nuraft::raft_server::commit_ret_elem> *)in_stack_fffffffffffffd30,
                   (shared_ptr<nuraft::raft_server::commit_ret_elem> *)in_stack_fffffffffffffd28);
        peVar9 = std::
                 __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2e4d96);
        if (peVar9->idx_ == local_70) {
          peVar9 = std::
                   __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2e4db4);
          peVar9->result_code_ = OK;
          std::
          __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e4dcb);
          std::shared_ptr<nuraft::buffer>::operator=
                    (&in_stack_fffffffffffffd30->empty_result_,
                     (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd28);
          local_e1 = 0;
          bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
          if (bVar3) {
            peVar6 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2e4e1b);
            iVar4 = (*peVar6->_vptr_logger[7])();
            if (4 < iVar4) {
              peVar6 = std::
                       __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2e4e54);
              uVar2 = local_70;
              peVar9 = std::
                       __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x2e4e79);
              msg_if_given_abi_cxx11_((char *)local_128,"notify cb %lu %p",uVar2,&peVar9->awaiter_);
              (*peVar6->_vptr_logger[8])
                        (peVar6,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                         ,"commit_app_log",0x151,local_128);
              std::__cxx11::string::~string(local_128);
            }
          }
          std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                    ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2e4f68)
          ;
          nuraft::context::get_params((context *)in_stack_fffffffffffffd48._M_node);
          peVar11 = std::
                    __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2e4f8c);
          rVar1 = peVar11->return_method_;
          std::shared_ptr<nuraft::raft_params>::~shared_ptr
                    ((shared_ptr<nuraft::raft_params> *)0x2e4f9d);
          if ((rVar1 == blocking) || (rVar1 != async_handler)) {
            peVar9 = std::
                     __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2e4fc1);
            if ((peVar9->callback_invoked_ & 1U) == 0) {
              std::
              __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2e5019);
              EventAwaiter::invoke
                        ((EventAwaiter *)
                         CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
            }
            else {
              local_140 = local_f0._M_node;
              local_148 = (_Base_ptr)
                          std::
                          map<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                          ::erase_abi_cxx11_((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                                              *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd38)
              ;
            }
          }
          else {
            std::__cxx11::
            list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
            ::push_back((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                        (value_type *)in_stack_fffffffffffffd38._M_node);
            local_150 = local_f0._M_node;
            local_158 = (_Base_ptr)
                        std::
                        map<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                        ::erase_abi_cxx11_((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                                            *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd38);
          }
        }
        std::shared_ptr<nuraft::raft_server::commit_ret_elem>::~shared_ptr
                  ((shared_ptr<nuraft::raft_server::commit_ret_elem> *)0x2e5091);
      }
      if ((local_e1 & 1) != 0) {
        cs_new<nuraft::raft_server::commit_ret_elem>();
        uVar2 = local_70;
        peVar9 = std::
                 __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2e50dc);
        peVar9->idx_ = uVar2;
        peVar9 = std::
                 __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2e50f1);
        peVar9->result_code_ = OK;
        std::
        __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2e5108);
        std::shared_ptr<nuraft::buffer>::operator=
                  (&in_stack_fffffffffffffd30->empty_result_,
                   (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd28);
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
        if (bVar3) {
          peVar6 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x2e5150);
          iVar4 = (*peVar6->_vptr_logger[7])();
          if (5 < iVar4) {
            peVar6 = std::
                     __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2e5183);
            uVar2 = local_70;
            peVar10 = std::
                      __shared_ptr<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2>
                      ::get(&local_168);
            msg_if_given_abi_cxx11_
                      ((char *)local_188,
                       "commit thread is invoked earlier than user thread, log %lu, elem %p",uVar2,
                       peVar10);
            (*peVar6->_vptr_logger[8])
                      (peVar6,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_app_log",0x171,local_188);
            std::__cxx11::string::~string(local_188);
          }
        }
        std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                  ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2e5255);
        nuraft::context::get_params((context *)in_stack_fffffffffffffd48._M_node);
        peVar11 = std::
                  __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2e5279);
        rVar1 = peVar11->return_method_;
        std::shared_ptr<nuraft::raft_params>::~shared_ptr
                  ((shared_ptr<nuraft::raft_params> *)0x2e528a);
        if ((rVar1 == blocking) || (rVar1 != async_handler)) {
          std::
          __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e52ae);
          EventAwaiter::invoke
                    ((EventAwaiter *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
        }
        else {
          std::
          __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e52cb);
          cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&>
                    ((shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd28);
          std::
          __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e52f1);
          std::
          shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
          ::operator=((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                       *)in_stack_fffffffffffffd30,
                      (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                       *)in_stack_fffffffffffffd28);
          std::
          shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
          ::~shared_ptr((shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                         *)0x2e5315);
        }
        in_stack_fffffffffffffd50 =
             (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
             (in_RDI + 0x4d8);
        std::make_pair<unsigned_long&,std::shared_ptr<nuraft::raft_server::commit_ret_elem>&>
                  ((unsigned_long *)in_stack_fffffffffffffd38._M_node,
                   (shared_ptr<nuraft::raft_server::commit_ret_elem> *)in_stack_fffffffffffffd30);
        _Var12 = std::
                 map<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                 ::
                 insert<std::pair<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                           ((map<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                            (pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>
                             *)in_stack_fffffffffffffd38._M_node);
        in_stack_fffffffffffffd48 = _Var12.first._M_node;
        local_1c8 = _Var12.second;
        in_stack_fffffffffffffd44 = CONCAT13(local_1c8,(int3)in_stack_fffffffffffffd44);
        local_1d0 = in_stack_fffffffffffffd48._M_node;
        std::pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>::~pair
                  ((pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *)
                   0x2e5389);
        std::shared_ptr<nuraft::raft_server::commit_ret_elem>::~shared_ptr
                  ((shared_ptr<nuraft::raft_server::commit_ret_elem> *)0x2e5396);
      }
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffd30);
    }
    local_1d8 = local_d0;
    local_1e0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
         ::begin((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                  *)in_stack_fffffffffffffd28);
    local_1e8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
         ::end((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
                *)in_stack_fffffffffffffd28);
    while (bVar3 = std::operator!=(&local_1e0,&local_1e8), bVar3) {
      local_1f8 = std::_List_iterator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>::
                  operator*((_List_iterator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>
                             *)0x2e544e);
      local_1f0 = local_1f8;
      peVar9 = std::
               __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2e5473);
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar9->async_result_);
      if (bVar3) {
        uVar13 = 0;
        code = (cmd_result_code)((ulong)local_208 >> 0x20);
        std::shared_ptr<std::exception>::shared_ptr
                  ((shared_ptr<std::exception> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28
                  );
        std::
        __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2e54b2);
        in_stack_fffffffffffffd30 =
             std::
             __shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e54c1);
        std::
        __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2e54d3);
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::set_result
                  (in_stack_fffffffffffffd50,
                   (shared_ptr<nuraft::buffer> *)in_stack_fffffffffffffd48._M_node,
                   (shared_ptr<std::exception> *)CONCAT44(in_stack_fffffffffffffd44,uVar13),code);
        std::
        __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2e54ff);
        std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(in_stack_fffffffffffffd44,uVar13));
        std::
        __shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<nuraft::raft_server::commit_ret_elem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x2e551b);
        std::
        __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
        ::reset((__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)CONCAT44(in_stack_fffffffffffffd44,uVar13));
        std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x2e5537);
      }
      std::_List_iterator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>::operator++
                (&local_1e0);
    }
    std::__cxx11::
    list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
    ::~list((list<std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::allocator<std::shared_ptr<nuraft::raft_server::commit_ret_elem>_>_>
             *)0x2e557d);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x2e558a);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x2e5597);
    return;
  }
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar3) {
    peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2e4ab7);
    iVar4 = (*peVar6->_vptr_logger[7])();
    if (0 < iVar4) {
      peVar6 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2e4af0);
      msg_if_given_abi_cxx11_
                ((char *)local_98,"pre-commit index %lu is smaller than commit index %lu",local_78,
                 local_70);
      (*peVar6->_vptr_logger[8])
                (peVar6,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_app_log",0x131,local_98);
      std::__cxx11::string::~string(local_98);
    }
  }
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x2e4bcf);
  peVar7 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2e4bd7);
  (*peVar7->_vptr_state_mgr[8])(peVar7,0xffffffe9);
  exit(-1);
}

Assistant:

void raft_server::commit_app_log(ulong idx_to_commit,
                                 ptr<log_entry>& le,
                                 bool need_to_handle_commit_elem)
{
    ptr<buffer> ret_value = nullptr;
    ptr<buffer> buf = le->get_buf_ptr();
    buf->pos(0);
    ulong sm_idx = idx_to_commit;
    ulong pc_idx = precommit_index_.load();
    if (pc_idx < sm_idx) {
        // Pre-commit should have been invoked, must be a bug.
        p_ft( "pre-commit index %" PRIu64 " is smaller than commit index %" PRIu64,
              pc_idx, sm_idx );
        ctx_->state_mgr_->system_exit(raft_err::N23_precommit_order_inversion);
        ::exit(-1);
    }
    ret_value = state_machine_->commit_ext
                ( state_machine::ext_op_params( sm_idx, buf ) );
    if (ret_value) ret_value->pos(0);

    std::list< ptr<commit_ret_elem> > async_elems;
    if (need_to_handle_commit_elem) {
        std::unique_lock<std::mutex> cre_lock(commit_ret_elems_lock_);
        /// Sometimes user can batch requests to RAFT: for example send 30
        /// append entries requests in a single batch. For such request batch
        /// user will receive a single response: all was successful or all
        /// failed. Obviously we don't need to add info about responses
        /// (commit_ret_elems) for 29 requests from batch and need to do it only
        /// for 30-th request. precommit_index is exact value which identify ID
        /// of the last request from the latest batch. So if we commiting this
        /// last request and for some reason it was not added into
        /// commit_ret_elems in the handle_cli_req method (logical race
        /// condition) we have to add it here. Otherwise we don't need to add
        /// anything into commit_ret_elems_, because nobody will wait for the
        /// responses of the intermediate requests from requests batch.
        bool need_to_check_commit_ret = sm_idx == pc_idx;

        auto entry = commit_ret_elems_.find(sm_idx);
        if (entry != commit_ret_elems_.end()) {
            ptr<commit_ret_elem> elem = entry->second;
            if (elem->idx_ == sm_idx) {
                elem->result_code_ = cmd_result_code::OK;
                elem->ret_value_ = ret_value;
                need_to_check_commit_ret = false;
                p_dv("notify cb %" PRIu64 " %p", sm_idx, &elem->awaiter_);

                switch (ctx_->get_params()->return_method_) {
                case raft_params::blocking:
                default:
                    // Blocking mode:
                    if (elem->callback_invoked_) {
                        // If elem callback invoked, remove it
                        commit_ret_elems_.erase(entry);
                    } else {
                        // or notify client that request done
                        elem->awaiter_.invoke();
                    }
                    break;

                case raft_params::async_handler:
                    // Async handler: put into list.
                    async_elems.push_back(elem);
                    commit_ret_elems_.erase(entry);
                    break;
                }
            }
        }

        if (need_to_check_commit_ret) {
            // If not found, commit thread is invoked earlier than user thread.
            // Create one here.
            ptr<commit_ret_elem> elem = cs_new<commit_ret_elem>();
            elem->idx_ = sm_idx;
            elem->result_code_ = cmd_result_code::OK;
            elem->ret_value_ = ret_value;
            p_tr("commit thread is invoked earlier than user thread, "
                 "log %" PRIu64 ", elem %p", sm_idx, elem.get());

            switch (ctx_->get_params()->return_method_) {
            case raft_params::blocking:
            default:
                elem->awaiter_.invoke(); // Callback will not sleep.
                break;
            case raft_params::async_handler:
                // Async handler:
                //   Set the result, but should not put it into the
                //   `async_elems` list, as the user thread (supposed to be
                //   executed right after this) will invoke the callback immediately.
                elem->async_result_ =
                    cs_new< cmd_result< ptr<buffer> > >( elem->ret_value_ );
                break;
            }
            commit_ret_elems_.insert( std::make_pair(sm_idx, elem) );
        }
    }

    // Calling handler should be done outside the mutex.
    for (auto& entry: async_elems) {
        ptr<commit_ret_elem>& elem = entry;
        if (elem->async_result_) {
            ptr<std::exception> err = nullptr;
            elem->async_result_->set_result( elem->ret_value_, err, cmd_result_code::OK );
            elem->ret_value_.reset();
            elem->async_result_.reset();
        }
    }
}